

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_sbc_CC(TCGContext_conflict1 *tcg_ctx,TCGv_i32 dest,TCGv_i32 t0,TCGv_i32 t1)

{
  TCGTemp *ts;
  uintptr_t o;
  
  ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_not_i32,(TCGArg)ts,(TCGArg)(t1 + (long)tcg_ctx));
  gen_adc_CC(tcg_ctx,dest,t0,(TCGv_i32)((long)ts - (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,ts);
  return;
}

Assistant:

static void gen_sbc_CC(TCGContext *tcg_ctx, TCGv_i32 dest, TCGv_i32 t0, TCGv_i32 t1)
{
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_not_i32(tcg_ctx, tmp, t1);
    gen_adc_CC(tcg_ctx, dest, t0, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);
}